

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementStyle.cpp
# Opt level: O1

float __thiscall
Rml::ElementStyle::ResolveNumericValue(ElementStyle *this,NumericValue value,float base_value)

{
  code *pcVar1;
  bool bVar2;
  Unit UVar3;
  float fVar4;
  
  fVar4 = value.number;
  if ((ulong)value >> 0x20 == 0x40) {
    return fVar4;
  }
  UVar3 = value.unit;
  if (((ulong)value >> 0x20 & 0x3fbc0) != 0) {
    fVar4 = ComputeLength(value,this->element);
    return fVar4;
  }
  if ((int)UVar3 < 0x400) {
    if (UVar3 == NUMBER) {
      return fVar4 * base_value;
    }
    if (UVar3 == PERCENT) {
      return fVar4 * base_value * 0.01;
    }
  }
  else {
    if (UVar3 == X) {
      return fVar4;
    }
    if ((UVar3 == DEG) || (UVar3 == RAD)) {
      fVar4 = ComputeAngle(value);
      return fVar4;
    }
  }
  bVar2 = Assert("RMLUI_ERROR",
                 "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementStyle.cpp"
                 ,0x18e);
  if (bVar2) {
    return 0.0;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

float ElementStyle::ResolveNumericValue(NumericValue value, float base_value) const
{
	if (value.unit == Unit::PX)
		return value.number;
	else if (Any(value.unit & Unit::LENGTH))
		return ComputeLength(value, element);

	switch (value.unit)
	{
	case Unit::NUMBER: return value.number * base_value;
	case Unit::PERCENT: return value.number * base_value * 0.01f;
	case Unit::X: return value.number;
	case Unit::DEG:
	case Unit::RAD: return ComputeAngle(value);
	default: break;
	}

	RMLUI_ERROR;
	return 0.f;
}